

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64
drwav_read_pcm_frames_s16(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  long in_RDX;
  drwav *in_RSI;
  long in_RDI;
  drwav_int16 *in_stack_00000038;
  drwav_uint64 in_stack_00000040;
  drwav *in_stack_00000048;
  drwav_uint64 in_stack_00000050;
  drwav *in_stack_00000058;
  drwav_int16 *in_stack_00001008;
  drwav_uint64 in_stack_00001010;
  drwav *in_stack_00001018;
  drwav_uint64 in_stack_00001020;
  drwav *in_stack_00001028;
  void *in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  if ((in_RDI == 0) || (in_RSI == (drwav *)0x0)) {
    local_8 = 0;
  }
  else if (in_RDX == 0) {
    local_8 = drwav_read_pcm_frames(in_RSI,0,in_stack_ffffffffffffffd8);
  }
  else if (*(short *)(in_RDI + 0x74) == 1) {
    local_8 = drwav_read_pcm_frames_s16__pcm
                        (in_stack_00001028,in_stack_00001020,(drwav_int16 *)in_stack_00001018);
  }
  else if (*(short *)(in_RDI + 0x74) == 3) {
    local_8 = drwav_read_pcm_frames_s16__ieee(in_stack_00001018,in_stack_00001010,in_stack_00001008)
    ;
  }
  else if (*(short *)(in_RDI + 0x74) == 6) {
    local_8 = drwav_read_pcm_frames_s16__alaw(in_stack_00001018,in_stack_00001010,in_stack_00001008)
    ;
  }
  else if (*(short *)(in_RDI + 0x74) == 7) {
    local_8 = drwav_read_pcm_frames_s16__mulaw
                        (in_stack_00001018,in_stack_00001010,in_stack_00001008);
  }
  else if (*(short *)(in_RDI + 0x74) == 2) {
    local_8 = drwav_read_pcm_frames_s16__msadpcm
                        (in_stack_00000058,in_stack_00000050,(drwav_int16 *)in_stack_00000048);
  }
  else if (*(short *)(in_RDI + 0x74) == 0x11) {
    local_8 = drwav_read_pcm_frames_s16__ima(in_stack_00000048,in_stack_00000040,in_stack_00000038);
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

DRWAV_API drwav_uint64 drwav_read_pcm_frames_s16(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }

    if (pBufferOut == NULL) {
        return drwav_read_pcm_frames(pWav, framesToRead, NULL);
    }

    /* Don't try to read more samples than can potentially fit in the output buffer. */
    if (framesToRead * pWav->channels * sizeof(drwav_int16) > DRWAV_SIZE_MAX) {
        framesToRead = DRWAV_SIZE_MAX / sizeof(drwav_int16) / pWav->channels;
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_PCM) {
        return drwav_read_pcm_frames_s16__pcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_IEEE_FLOAT) {
        return drwav_read_pcm_frames_s16__ieee(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ALAW) {
        return drwav_read_pcm_frames_s16__alaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_MULAW) {
        return drwav_read_pcm_frames_s16__mulaw(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        return drwav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, pBufferOut);
    }

    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        return drwav_read_pcm_frames_s16__ima(pWav, framesToRead, pBufferOut);
    }

    return 0;
}